

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitfoot.h
# Opt level: O0

void __thiscall bitfoot::Bitfoot::SetHashSize(Bitfoot *this,int64_t mbytes)

{
  bool bVar1;
  Output *pOVar2;
  Output local_20;
  int64_t local_18;
  int64_t mbytes_local;
  Bitfoot *this_local;
  
  local_18 = mbytes;
  mbytes_local = (int64_t)this;
  bVar1 = TranspositionTable::Resize((TranspositionTable *)_tt,mbytes);
  if (!bVar1) {
    senjo::Output::Output(&local_20,InfoPrefix);
    pOVar2 = senjo::Output::operator<<(&local_20,(char (*) [31])"cannot allocate hash table of ");
    pOVar2 = senjo::Output::operator<<(pOVar2,&local_18);
    senjo::Output::operator<<(pOVar2,(char (*) [4])" MB");
    senjo::Output::~Output(&local_20);
  }
  return;
}

Assistant:

void SetHashSize(const int64_t mbytes) {
    if (!_tt.Resize(mbytes)) {
      senjo::Output() << "cannot allocate hash table of " << mbytes << " MB";
    }
  }